

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,char (*rhs) [6])

{
  lest *this_00;
  char (*in_R8) [6];
  allocator local_e1;
  string local_e0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_c0 [2];
  string local_a0;
  text local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  bool local_49;
  result local_48;
  string *local_20;
  char (*rhs_local) [6];
  expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
  *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (char (*) [6])this;
  this_local = (expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
                *)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,*(basic_string_view<char,_std::char_traits<char>_> **)this);
  local_49 = nonstd::sv_lite::operator<(&local_60,(char *)local_20);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"<",&local_e1);
  std::__cxx11::string::string((string *)local_c0,local_e0);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_a0,this_00,local_c0,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_a0);
  result::result<bool>(&local_48,&local_49,&local_80);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }